

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall clog::Logger::Impl::finish(Impl *this)

{
  ulong __n;
  LogStream *pLVar1;
  char **ppcVar2;
  ulong uVar3;
  char *pcVar4;
  
  ppcVar2 = &(this->_stream)._buffer.cur_;
  pcVar4 = (this->_stream)._buffer.cur_;
  uVar3 = (long)ppcVar2 - (long)pcVar4;
  if (3 < uVar3) {
    pcVar4[2] = ' ';
    pcVar4[0] = ' ';
    pcVar4[1] = '-';
    pcVar4 = *ppcVar2 + 3;
    *ppcVar2 = pcVar4;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
  }
  __n = (this->_file)._size;
  if (__n < uVar3) {
    memcpy(pcVar4,(this->_file)._data,__n);
    pcVar4 = (this->_stream)._buffer.cur_ + __n;
    (this->_stream)._buffer.cur_ = pcVar4;
    uVar3 = (long)ppcVar2 - (long)pcVar4;
  }
  if (1 < uVar3) {
    *pcVar4 = ':';
    *ppcVar2 = *ppcVar2 + 1;
  }
  pLVar1 = LogStream::operator<<(&this->_stream,this->_line);
  pcVar4 = (pLVar1->_buffer).cur_;
  ppcVar2 = &(pLVar1->_buffer).cur_;
  if (1 < (ulong)((long)ppcVar2 - (long)pcVar4)) {
    *pcVar4 = '\n';
    *ppcVar2 = *ppcVar2 + 1;
  }
  return;
}

Assistant:

void Logger::Impl::finish()
{
    _stream << " - " << _file << ":" << _line << "\n\0"; 
}